

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O2

int tnt_object_verify(tnt_stream *obj,int8_t type)

{
  int iVar1;
  int iVar2;
  byte *end;
  byte *local_20;
  char *pos;
  
  local_20 = *obj->data;
  end = local_20 + *(long *)((long)obj->data + 8);
  iVar2 = -1;
  if ((type < '\0') || (mp_type_hint[*local_20] == (uint)(byte)type)) {
    iVar1 = mp_check((char **)&local_20,(char *)end);
    if (iVar1 == 0) {
      iVar2 = -(uint)(local_20 < end);
    }
  }
  return iVar2;
}

Assistant:

int tnt_object_verify(struct tnt_stream *obj, int8_t type)
{
	const char *pos = TNT_SBUF_DATA(obj);
	const char *end = pos + TNT_SBUF_SIZE(obj);
	if (type >= 0 && mp_typeof(*pos) != (uint8_t) type) return -1;
	if (mp_check(&pos, end)) return -1;
	if (pos < end) return -1;
	return 0;
}